

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlSaveFormatFileEnc(char *filename,xmlDocPtr cur,char *encoding,int format)

{
  xmlOutputBufferPtr buf_00;
  xmlOutputBufferPtr buf;
  int format_local;
  char *encoding_local;
  xmlDocPtr cur_local;
  char *filename_local;
  
  if (cur == (xmlDocPtr)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    buf_00 = xmlOutputBufferCreateFilename(filename,(xmlCharEncodingHandlerPtr)0x0,cur->compression)
    ;
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      filename_local._4_4_ = -1;
    }
    else {
      xmlDocDumpInternal(buf_00,cur,encoding,format);
      filename_local._4_4_ = xmlOutputBufferClose(buf_00);
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
xmlSaveFormatFileEnc( const char * filename, xmlDocPtr cur,
			const char * encoding, int format ) {
    xmlOutputBufferPtr buf;

    if (cur == NULL)
	return(-1);

#ifdef LIBXML_ZLIB_ENABLED
    if (cur->compression < 0) cur->compression = xmlGetCompressMode();
#endif
    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, NULL, cur->compression);
    if (buf == NULL) return(-1);

    xmlDocDumpInternal(buf, cur, encoding, format);

    return(xmlOutputBufferClose(buf));
}